

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::memorypool::poolinit
          (memorypool *this,int bytecount,int itemcount,int wordsize,int alignment)

{
  int iVar1;
  void **ppvVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  if (alignment <= wordsize) {
    alignment = wordsize;
  }
  uVar4 = 8;
  if (8 < alignment) {
    uVar4 = (ulong)(uint)alignment;
  }
  iVar1 = (int)uVar4;
  this->alignbytes = iVar1;
  iVar1 = (iVar1 / wordsize) * ((bytecount + iVar1 + -1) / iVar1);
  this->itemwords = iVar1;
  iVar1 = iVar1 * wordsize;
  this->itembytes = iVar1;
  this->itemsperblock = itemcount;
  ppvVar2 = (void **)malloc(uVar4 + (long)(iVar1 * itemcount) + 8);
  this->firstblock = ppvVar2;
  if (ppvVar2 != (void **)0x0) {
    *ppvVar2 = (void *)0x0;
    this->items = 0;
    this->maxitems = 0;
    this->nowblock = ppvVar2;
    this->nextitem = (void *)((long)ppvVar2 + ((uVar4 + 8) - (ulong)(ppvVar2 + 1) % uVar4));
    this->unallocateditems = itemcount;
    this->deaditemstack = (void *)0x0;
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 1;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

void tetgenmesh::memorypool::poolinit(int bytecount,int itemcount,int wordsize,
                                      int alignment)
{
  // Find the proper alignment, which must be at least as large as:
  //   - The parameter `alignment'.
  //   - The primary word type, to avoid unaligned accesses.
  //   - sizeof(void *), so the stack of dead items can be maintained
  //       without unaligned accesses.
  if (alignment > wordsize) {
    alignbytes = alignment;
  } else {
    alignbytes = wordsize;
  }
  if ((int) sizeof(void *) > alignbytes) {
    alignbytes = (int) sizeof(void *);
  }
  itemwords = ((bytecount + alignbytes - 1) /  alignbytes)
            * (alignbytes / wordsize);
  itembytes = itemwords * wordsize;
  itemsperblock = itemcount;

  // Allocate a block of items.  Space for `itemsperblock' items and one
  //   pointer (to point to the next block) are allocated, as well as space
  //   to ensure alignment of the items. 
  firstblock = (void **) malloc(itemsperblock * itembytes + sizeof(void *)
                                + alignbytes); 
  if (firstblock == (void **) NULL) {
    terminatetetgen(NULL, 1);
  }
  // Set the next block pointer to NULL.
  *(firstblock) = (void *) NULL;
  restart();
}